

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

void HTS_ModelSet_get_parameter
               (HTS_ModelSet *ms,size_t stream_index,size_t state_index,char *string,double **iw,
               double *mean,double *vari,double *msd)

{
  double dVar1;
  long lVar2;
  long lVar3;
  double *in_RCX;
  double *in_RDX;
  char *in_RSI;
  size_t in_RDI;
  double *in_R8;
  double in_R9;
  HTS_Model *unaff_retaddr;
  size_t len;
  size_t i;
  ulong local_38;
  
  lVar2 = *(long *)(**(long **)(in_RDI + 0x68) + (long)in_RSI * 0x40);
  lVar3 = *(long *)(**(long **)(in_RDI + 0x68) + (long)in_RSI * 0x40 + 8);
  for (local_38 = 0; local_38 < (ulong)(lVar2 * lVar3); local_38 = local_38 + 1) {
    *(undefined8 *)((long)in_R9 + local_38 * 8) = 0;
    *(undefined8 *)(len + local_38 * 8) = 0;
  }
  if (i != 0) {
    *(undefined8 *)i = 0;
  }
  for (local_38 = 0; local_38 < *(ulong *)(in_RDI + 0x18); local_38 = local_38 + 1) {
    dVar1 = *(double *)((long)in_R8[local_38] + (long)in_RSI * 8);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      HTS_Model_add_parameter(unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9);
    }
  }
  return;
}

Assistant:

void HTS_ModelSet_get_parameter(HTS_ModelSet * ms, size_t stream_index, size_t state_index, const char *string, const double *const *iw, double *mean, double *vari, double *msd)
{
   size_t i;
   size_t len = ms->stream[0][stream_index].vector_length * ms->stream[0][stream_index].num_windows;

   for (i = 0; i < len; i++) {
      mean[i] = 0.0;
      vari[i] = 0.0;
   }
   if (msd != NULL)
      *msd = 0.0;

   for (i = 0; i < ms->num_voices; i++)
      if (iw[i][stream_index] != 0.0)
         HTS_Model_add_parameter(&ms->stream[i][stream_index], state_index, string, mean, vari, msd, iw[i][stream_index]);
}